

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScriptGenerator.cxx
# Opt level: O0

void __thiscall
cmScriptGenerator::GenerateScriptActionsPerConfig(cmScriptGenerator *this,ostream *os,Indent indent)

{
  bool bVar1;
  uint uVar2;
  cmScriptGeneratorIndent cVar3;
  char *pcVar4;
  ostream *poVar5;
  allocator local_e1;
  string local_e0 [32];
  int local_c0;
  allocator local_b9;
  string local_b8;
  undefined1 local_98 [8];
  string config_test;
  allocator local_61;
  string local_60;
  char *local_40;
  char *config;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  const_iterator i;
  bool first;
  ostream *os_local;
  cmScriptGenerator *this_local;
  Indent indent_local;
  
  this_local._4_4_ = indent.Level;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(this->ConfigurationTypes);
  if (bVar1) {
    i._M_current._4_4_ = this_local._4_4_;
    GenerateScriptActionsOnce(this,os,this_local._4_4_);
  }
  else {
    i._M_current._3_1_ = 1;
    local_30._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(this->ConfigurationTypes);
    while( true ) {
      config = (char *)std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end(this->ConfigurationTypes);
      bVar1 = __gnu_cxx::operator!=
                        (&local_30,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&config);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_30);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_40 = pcVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_60,pcVar4,&local_61);
      bVar1 = GeneratesForConfig(this,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
      pcVar4 = local_40;
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_b8,pcVar4,&local_b9);
        CreateConfigTest((string *)local_98,this,&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_b9);
        local_c0 = this_local._4_4_;
        poVar5 = ::operator<<(os,(cmScriptGeneratorIndent)this_local._4_4_);
        pcVar4 = "elseif(";
        if ((i._M_current._3_1_ & 1) != 0) {
          pcVar4 = "if(";
        }
        poVar5 = std::operator<<(poVar5,pcVar4);
        poVar5 = std::operator<<(poVar5,(string *)local_98);
        std::operator<<(poVar5,")\n");
        pcVar4 = local_40;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_e0,pcVar4,&local_e1);
        cVar3 = cmScriptGeneratorIndent::Next((cmScriptGeneratorIndent *)((long)&this_local + 4),2);
        (*this->_vptr_cmScriptGenerator[5])(this,os,local_e0,(ulong)(uint)cVar3.Level);
        std::__cxx11::string::~string(local_e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_e1);
        i._M_current._3_1_ = 0;
        std::__cxx11::string::~string((string *)local_98);
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_30);
    }
    if ((i._M_current._3_1_ & 1) == 0) {
      uVar2 = (*this->_vptr_cmScriptGenerator[7])();
      if ((uVar2 & 1) != 0) {
        poVar5 = ::operator<<(os,(cmScriptGeneratorIndent)this_local._4_4_);
        std::operator<<(poVar5,"else()\n");
        cVar3 = cmScriptGeneratorIndent::Next((cmScriptGeneratorIndent *)((long)&this_local + 4),2);
        (*this->_vptr_cmScriptGenerator[6])(this,os,(ulong)(uint)cVar3.Level);
      }
      poVar5 = ::operator<<(os,(cmScriptGeneratorIndent)this_local._4_4_);
      std::operator<<(poVar5,"endif()\n");
    }
  }
  return;
}

Assistant:

void cmScriptGenerator::GenerateScriptActionsPerConfig(std::ostream& os,
                                                       Indent indent)
{
  if (this->ConfigurationTypes->empty()) {
    // In a single-configuration generator there is only one action
    // and it applies if the runtime-requested configuration is among
    // the rule's allowed configurations.  The configuration built in
    // the tree does not matter for this decision but will be used to
    // generate proper target file names into the code.
    this->GenerateScriptActionsOnce(os, indent);
  } else {
    // In a multi-configuration generator we produce a separate rule
    // in a block for each configuration that is built.  We restrict
    // the list of configurations to those to which this rule applies.
    bool first = true;
    for (std::vector<std::string>::const_iterator i =
           this->ConfigurationTypes->begin();
         i != this->ConfigurationTypes->end(); ++i) {
      const char* config = i->c_str();
      if (this->GeneratesForConfig(config)) {
        // Generate a per-configuration block.
        std::string config_test = this->CreateConfigTest(config);
        os << indent << (first ? "if(" : "elseif(") << config_test << ")\n";
        this->GenerateScriptForConfig(os, config, indent.Next());
        first = false;
      }
    }
    if (!first) {
      if (this->NeedsScriptNoConfig()) {
        os << indent << "else()\n";
        this->GenerateScriptNoConfig(os, indent.Next());
      }
      os << indent << "endif()\n";
    }
  }
}